

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

Aig_Obj_t * Rtm_ManToAig_rec(Aig_Man_t *pNew,Rtm_Man_t *pRtm,Rtm_Obj_t *pObjRtm,int *pLatches)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p0;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  
  p0 = (Aig_Obj_t *)pObjRtm->pCopy;
  if (p0 == (Aig_Obj_t *)0x0) {
    p0 = pNew->pConst1;
    puVar3 = (uint *)&pObjRtm[1].field_0x8;
    for (uVar5 = 0; uVar5 < (*(uint *)&pObjRtm->field_0x8 >> 7 & 0xff); uVar5 = uVar5 + 1) {
      uVar4 = *puVar3;
      uVar1 = uVar4 & 0xfff;
      if (uVar1 == 0) {
        pAVar2 = Rtm_ManToAig_rec(pNew,pRtm,*(Rtm_Obj_t **)(puVar3 + -2),pLatches);
      }
      else {
        if (uVar1 < 0xb) {
          uVar4 = uVar4 >> 0xc;
        }
        else {
          uVar4 = pRtm->pExtra[uVar4 >> 0xc];
        }
        pAVar2 = Aig_ManCi(pNew,uVar1 + pLatches[uVar5 + (long)pObjRtm->Id * 2] + -1);
        pAVar2 = (Aig_Obj_t *)((ulong)((uVar4 & 3) == 2) ^ (ulong)pAVar2);
      }
      p0 = Aig_And(pNew,p0,(Aig_Obj_t *)
                           ((ulong)((*(uint *)&pObjRtm->field_0x8 >>
                                     ((byte)(6 - (uVar5 == 0)) & 0x1f) & 1) != 0) ^ (ulong)pAVar2));
      puVar3 = puVar3 + 4;
    }
    pObjRtm->pCopy = p0;
  }
  return p0;
}

Assistant:

Aig_Obj_t * Rtm_ManToAig_rec( Aig_Man_t * pNew, Rtm_Man_t * pRtm, Rtm_Obj_t * pObjRtm, int * pLatches )
{
    Rtm_Edg_t * pEdge;
    Aig_Obj_t * pRes, * pFanin;
    int k, Val;
    if ( pObjRtm->pCopy )
        return (Aig_Obj_t *)pObjRtm->pCopy;
    // get the inputs
    pRes = Aig_ManConst1( pNew );
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        if ( pEdge->nLats == 0 )
            pFanin = Rtm_ManToAig_rec( pNew, pRtm, Rtm_ObjFanin(pObjRtm, k), pLatches );
        else
        {
            Val = Rtm_ObjGetFirst( pRtm, pEdge );
            pFanin = Aig_ManCi( pNew, pLatches[2*pObjRtm->Id + k] + pEdge->nLats - 1 );
            pFanin = Aig_NotCond( pFanin, Val == RTM_VAL_ONE );
        }
        pFanin = Aig_NotCond( pFanin, k ? pObjRtm->fCompl1 : pObjRtm->fCompl0 );
        pRes = Aig_And( pNew, pRes, pFanin );
    }
    return (Aig_Obj_t *)(pObjRtm->pCopy = pRes);
}